

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

void __thiscall Centaurus::Grammar<char>::print_nfa(Grammar<char> *this,wostream *os,ATNPath *path)

{
  ATNPath *pAVar1;
  ATNNodeType AVar2;
  SimpleException *this_00;
  NFA<char> *pNVar3;
  Identifier *this_01;
  wstring *pwVar4;
  NFA<char> *nfa;
  allocator local_49;
  string local_48;
  ATNNode<char> *local_28;
  ATNNode<char> *node;
  ATNPath *path_local;
  wostream *os_local;
  Grammar<char> *this_local;
  
  node = (ATNNode<char> *)path;
  path_local = (ATNPath *)os;
  os_local = (wostream *)this;
  local_28 = resolve(this,path);
  AVar2 = ATNNode<char>::type(local_28);
  if (AVar2 != RegularTerminal) {
    this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"The specified node is not an NFA.",&local_49);
    SimpleException::SimpleException(this_00,&local_48);
    __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
  }
  pNVar3 = ATNNode<char>::get_nfa(local_28);
  pAVar1 = path_local;
  this_01 = ATNPath::leaf_id((ATNPath *)node);
  pwVar4 = Identifier::str_abi_cxx11_(this_01);
  (*(pNVar3->super_NFABase<Centaurus::NFABaseState<char,_int>_>)._vptr_NFABase[3])
            (pNVar3,pAVar1,pwVar4);
  return;
}

Assistant:

virtual void print_nfa(std::wostream& os, const ATNPath& path) const override
    {
        const ATNNode<TCHAR>& node = resolve(path);

        if (node.type() != ATNNodeType::RegularTerminal)
        {
            throw SimpleException("The specified node is not an NFA.");
        }
        else
        {
            const NFA<TCHAR>& nfa = node.get_nfa();

            nfa.print(os, path.leaf_id().str());
        }
    }